

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O2

pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> * __thiscall
OpenMD::Sphere::getBoundingBox
          (pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *__return_storage_ptr__,
          Sphere *this)

{
  RealType RVar1;
  Vector3d r;
  Vector<double,_3U> local_50;
  Vector<double,_3U> local_38;
  
  std::pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_>::
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>,_true>(__return_storage_ptr__);
  RVar1 = this->radius_;
  Vector<double,_3U>::Vector(&local_38);
  local_38.data_[0] = RVar1;
  local_38.data_[1] = RVar1;
  local_38.data_[2] = RVar1;
  operator-(&local_50,&(this->origin_).super_Vector<double,_3U>,&local_38);
  Vector3<double>::operator=(&__return_storage_ptr__->first,&local_50);
  OpenMD::operator+(&local_50,&(this->origin_).super_Vector<double,_3U>,&local_38);
  Vector3<double>::operator=(&__return_storage_ptr__->second,&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Vector3d, Vector3d> Sphere::getBoundingBox() {
    std::pair<Vector3d, Vector3d> boundary;
    Vector3d r(radius_, radius_, radius_);
    boundary.first  = origin_ - r;
    boundary.second = origin_ + r;
    return boundary;
  }